

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O2

__m128i get_coeff_contexts_kernel_sse2(__m128i *level)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  longlong in_RAX;
  longlong in_RDX;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  __m128i alVar81;
  
  bVar1 = (byte)(*level)[0];
  bVar2 = *(byte *)((long)*level + 1);
  bVar3 = *(byte *)((long)*level + 2);
  bVar4 = *(byte *)((long)*level + 3);
  bVar5 = *(byte *)((long)*level + 4);
  bVar6 = *(byte *)((long)*level + 5);
  bVar7 = *(byte *)((long)*level + 6);
  bVar8 = *(byte *)((long)*level + 7);
  bVar9 = (byte)(*level)[1];
  bVar10 = *(byte *)((long)*level + 9);
  bVar11 = *(byte *)((long)*level + 10);
  bVar12 = *(byte *)((long)*level + 0xb);
  bVar13 = *(byte *)((long)*level + 0xc);
  bVar14 = *(byte *)((long)*level + 0xd);
  bVar15 = *(byte *)((long)*level + 0xe);
  bVar16 = *(byte *)((long)*level + 0xf);
  bVar17 = (byte)level[1][0];
  bVar18 = *(byte *)((long)level[1] + 1);
  bVar19 = *(byte *)((long)level[1] + 2);
  bVar20 = *(byte *)((long)level[1] + 3);
  bVar21 = *(byte *)((long)level[1] + 4);
  bVar22 = *(byte *)((long)level[1] + 5);
  bVar23 = *(byte *)((long)level[1] + 6);
  bVar24 = *(byte *)((long)level[1] + 7);
  bVar25 = (byte)level[1][1];
  bVar26 = *(byte *)((long)level[1] + 9);
  bVar27 = *(byte *)((long)level[1] + 10);
  bVar28 = *(byte *)((long)level[1] + 0xb);
  bVar29 = *(byte *)((long)level[1] + 0xc);
  bVar30 = *(byte *)((long)level[1] + 0xd);
  bVar31 = *(byte *)((long)level[1] + 0xe);
  bVar32 = *(byte *)((long)level[1] + 0xf);
  bVar33 = (3 < bVar17) * '\x03' | (3 >= bVar17) * bVar17;
  bVar34 = (3 < bVar18) * '\x03' | (3 >= bVar18) * bVar18;
  bVar35 = (3 < bVar19) * '\x03' | (3 >= bVar19) * bVar19;
  bVar36 = (3 < bVar20) * '\x03' | (3 >= bVar20) * bVar20;
  bVar37 = (3 < bVar21) * '\x03' | (3 >= bVar21) * bVar21;
  bVar38 = (3 < bVar22) * '\x03' | (3 >= bVar22) * bVar22;
  bVar39 = (3 < bVar23) * '\x03' | (3 >= bVar23) * bVar23;
  bVar40 = (3 < bVar24) * '\x03' | (3 >= bVar24) * bVar24;
  bVar41 = (3 < bVar25) * '\x03' | (3 >= bVar25) * bVar25;
  bVar42 = (3 < bVar26) * '\x03' | (3 >= bVar26) * bVar26;
  bVar43 = (3 < bVar27) * '\x03' | (3 >= bVar27) * bVar27;
  bVar44 = (3 < bVar28) * '\x03' | (3 >= bVar28) * bVar28;
  bVar45 = (3 < bVar29) * '\x03' | (3 >= bVar29) * bVar29;
  bVar46 = (3 < bVar30) * '\x03' | (3 >= bVar30) * bVar30;
  bVar47 = (3 < bVar31) * '\x03' | (3 >= bVar31) * bVar31;
  bVar48 = (3 < bVar32) * '\x03' | (3 >= bVar32) * bVar32;
  *(byte *)level[1] = bVar33;
  *(byte *)((long)level[1] + 1) = bVar34;
  *(byte *)((long)level[1] + 2) = bVar35;
  *(byte *)((long)level[1] + 3) = bVar36;
  *(byte *)((long)level[1] + 4) = bVar37;
  *(byte *)((long)level[1] + 5) = bVar38;
  *(byte *)((long)level[1] + 6) = bVar39;
  *(byte *)((long)level[1] + 7) = bVar40;
  *(byte *)(level[1] + 1) = bVar41;
  *(byte *)((long)level[1] + 9) = bVar42;
  *(byte *)((long)level[1] + 10) = bVar43;
  *(byte *)((long)level[1] + 0xb) = bVar44;
  *(byte *)((long)level[1] + 0xc) = bVar45;
  *(byte *)((long)level[1] + 0xd) = bVar46;
  *(byte *)((long)level[1] + 0xe) = bVar47;
  *(byte *)((long)level[1] + 0xf) = bVar48;
  bVar17 = (byte)level[2][0];
  bVar18 = *(byte *)((long)level[2] + 1);
  bVar19 = *(byte *)((long)level[2] + 2);
  bVar20 = *(byte *)((long)level[2] + 3);
  bVar21 = *(byte *)((long)level[2] + 4);
  bVar22 = *(byte *)((long)level[2] + 5);
  bVar23 = *(byte *)((long)level[2] + 6);
  bVar24 = *(byte *)((long)level[2] + 7);
  bVar25 = (byte)level[2][1];
  bVar26 = *(byte *)((long)level[2] + 9);
  bVar27 = *(byte *)((long)level[2] + 10);
  bVar28 = *(byte *)((long)level[2] + 0xb);
  bVar29 = *(byte *)((long)level[2] + 0xc);
  bVar30 = *(byte *)((long)level[2] + 0xd);
  bVar31 = *(byte *)((long)level[2] + 0xe);
  bVar32 = *(byte *)((long)level[2] + 0xf);
  bVar49 = (3 < bVar17) * '\x03' | (3 >= bVar17) * bVar17;
  bVar50 = (3 < bVar18) * '\x03' | (3 >= bVar18) * bVar18;
  bVar51 = (3 < bVar19) * '\x03' | (3 >= bVar19) * bVar19;
  bVar52 = (3 < bVar20) * '\x03' | (3 >= bVar20) * bVar20;
  bVar53 = (3 < bVar21) * '\x03' | (3 >= bVar21) * bVar21;
  bVar54 = (3 < bVar22) * '\x03' | (3 >= bVar22) * bVar22;
  bVar55 = (3 < bVar23) * '\x03' | (3 >= bVar23) * bVar23;
  bVar56 = (3 < bVar24) * '\x03' | (3 >= bVar24) * bVar24;
  bVar57 = (3 < bVar25) * '\x03' | (3 >= bVar25) * bVar25;
  bVar58 = (3 < bVar26) * '\x03' | (3 >= bVar26) * bVar26;
  bVar59 = (3 < bVar27) * '\x03' | (3 >= bVar27) * bVar27;
  bVar60 = (3 < bVar28) * '\x03' | (3 >= bVar28) * bVar28;
  bVar61 = (3 < bVar29) * '\x03' | (3 >= bVar29) * bVar29;
  bVar62 = (3 < bVar30) * '\x03' | (3 >= bVar30) * bVar30;
  bVar63 = (3 < bVar31) * '\x03' | (3 >= bVar31) * bVar31;
  bVar64 = (3 < bVar32) * '\x03' | (3 >= bVar32) * bVar32;
  *(byte *)level[2] = bVar49;
  *(byte *)((long)level[2] + 1) = bVar50;
  *(byte *)((long)level[2] + 2) = bVar51;
  *(byte *)((long)level[2] + 3) = bVar52;
  *(byte *)((long)level[2] + 4) = bVar53;
  *(byte *)((long)level[2] + 5) = bVar54;
  *(byte *)((long)level[2] + 6) = bVar55;
  *(byte *)((long)level[2] + 7) = bVar56;
  *(byte *)(level[2] + 1) = bVar57;
  *(byte *)((long)level[2] + 9) = bVar58;
  *(byte *)((long)level[2] + 10) = bVar59;
  *(byte *)((long)level[2] + 0xb) = bVar60;
  *(byte *)((long)level[2] + 0xc) = bVar61;
  *(byte *)((long)level[2] + 0xd) = bVar62;
  *(byte *)((long)level[2] + 0xe) = bVar63;
  *(byte *)((long)level[2] + 0xf) = bVar64;
  bVar17 = (byte)level[3][0];
  bVar18 = *(byte *)((long)level[3] + 1);
  bVar19 = *(byte *)((long)level[3] + 2);
  bVar20 = *(byte *)((long)level[3] + 3);
  bVar21 = *(byte *)((long)level[3] + 4);
  bVar22 = *(byte *)((long)level[3] + 5);
  bVar23 = *(byte *)((long)level[3] + 6);
  bVar24 = *(byte *)((long)level[3] + 7);
  bVar25 = (byte)level[3][1];
  bVar26 = *(byte *)((long)level[3] + 9);
  bVar27 = *(byte *)((long)level[3] + 10);
  bVar28 = *(byte *)((long)level[3] + 0xb);
  bVar29 = *(byte *)((long)level[3] + 0xc);
  bVar30 = *(byte *)((long)level[3] + 0xd);
  bVar31 = *(byte *)((long)level[3] + 0xe);
  bVar32 = *(byte *)((long)level[3] + 0xf);
  bVar65 = (3 < bVar17) * '\x03' | (3 >= bVar17) * bVar17;
  bVar66 = (3 < bVar18) * '\x03' | (3 >= bVar18) * bVar18;
  bVar67 = (3 < bVar19) * '\x03' | (3 >= bVar19) * bVar19;
  bVar68 = (3 < bVar20) * '\x03' | (3 >= bVar20) * bVar20;
  bVar69 = (3 < bVar21) * '\x03' | (3 >= bVar21) * bVar21;
  bVar70 = (3 < bVar22) * '\x03' | (3 >= bVar22) * bVar22;
  bVar71 = (3 < bVar23) * '\x03' | (3 >= bVar23) * bVar23;
  bVar72 = (3 < bVar24) * '\x03' | (3 >= bVar24) * bVar24;
  bVar73 = (3 < bVar25) * '\x03' | (3 >= bVar25) * bVar25;
  bVar74 = (3 < bVar26) * '\x03' | (3 >= bVar26) * bVar26;
  bVar75 = (3 < bVar27) * '\x03' | (3 >= bVar27) * bVar27;
  bVar76 = (3 < bVar28) * '\x03' | (3 >= bVar28) * bVar28;
  bVar77 = (3 < bVar29) * '\x03' | (3 >= bVar29) * bVar29;
  bVar78 = (3 < bVar30) * '\x03' | (3 >= bVar30) * bVar30;
  bVar79 = (3 < bVar31) * '\x03' | (3 >= bVar31) * bVar31;
  bVar80 = (3 < bVar32) * '\x03' | (3 >= bVar32) * bVar32;
  *(byte *)level[3] = bVar65;
  *(byte *)((long)level[3] + 1) = bVar66;
  *(byte *)((long)level[3] + 2) = bVar67;
  *(byte *)((long)level[3] + 3) = bVar68;
  *(byte *)((long)level[3] + 4) = bVar69;
  *(byte *)((long)level[3] + 5) = bVar70;
  *(byte *)((long)level[3] + 6) = bVar71;
  *(byte *)((long)level[3] + 7) = bVar72;
  *(byte *)(level[3] + 1) = bVar73;
  *(byte *)((long)level[3] + 9) = bVar74;
  *(byte *)((long)level[3] + 10) = bVar75;
  *(byte *)((long)level[3] + 0xb) = bVar76;
  *(byte *)((long)level[3] + 0xc) = bVar77;
  *(byte *)((long)level[3] + 0xd) = bVar78;
  *(byte *)((long)level[3] + 0xe) = bVar79;
  *(byte *)((long)level[3] + 0xf) = bVar80;
  bVar17 = (byte)level[4][0];
  bVar18 = *(byte *)((long)level[4] + 1);
  bVar19 = *(byte *)((long)level[4] + 2);
  bVar20 = *(byte *)((long)level[4] + 3);
  bVar21 = *(byte *)((long)level[4] + 4);
  bVar22 = *(byte *)((long)level[4] + 5);
  bVar23 = *(byte *)((long)level[4] + 6);
  bVar24 = *(byte *)((long)level[4] + 7);
  bVar25 = (byte)level[4][1];
  bVar26 = *(byte *)((long)level[4] + 9);
  bVar27 = *(byte *)((long)level[4] + 10);
  bVar28 = *(byte *)((long)level[4] + 0xb);
  bVar29 = *(byte *)((long)level[4] + 0xc);
  bVar30 = *(byte *)((long)level[4] + 0xd);
  bVar31 = *(byte *)((long)level[4] + 0xe);
  bVar32 = *(byte *)((long)level[4] + 0xf);
  bVar17 = (bVar17 < 3) * bVar17 | (bVar17 >= 3) * '\x03';
  bVar18 = (bVar18 < 3) * bVar18 | (bVar18 >= 3) * '\x03';
  bVar19 = (bVar19 < 3) * bVar19 | (bVar19 >= 3) * '\x03';
  bVar20 = (bVar20 < 3) * bVar20 | (bVar20 >= 3) * '\x03';
  bVar21 = (bVar21 < 3) * bVar21 | (bVar21 >= 3) * '\x03';
  bVar22 = (bVar22 < 3) * bVar22 | (bVar22 >= 3) * '\x03';
  bVar23 = (bVar23 < 3) * bVar23 | (bVar23 >= 3) * '\x03';
  bVar24 = (bVar24 < 3) * bVar24 | (bVar24 >= 3) * '\x03';
  bVar25 = (bVar25 < 3) * bVar25 | (bVar25 >= 3) * '\x03';
  bVar26 = (bVar26 < 3) * bVar26 | (bVar26 >= 3) * '\x03';
  bVar27 = (bVar27 < 3) * bVar27 | (bVar27 >= 3) * '\x03';
  bVar28 = (bVar28 < 3) * bVar28 | (bVar28 >= 3) * '\x03';
  bVar29 = (bVar29 < 3) * bVar29 | (bVar29 >= 3) * '\x03';
  bVar30 = (bVar30 < 3) * bVar30 | (bVar30 >= 3) * '\x03';
  bVar31 = (bVar31 < 3) * bVar31 | (bVar31 >= 3) * '\x03';
  bVar32 = (bVar32 < 3) * bVar32 | (bVar32 >= 3) * '\x03';
  *(byte *)level[4] = bVar17;
  *(byte *)((long)level[4] + 1) = bVar18;
  *(byte *)((long)level[4] + 2) = bVar19;
  *(byte *)((long)level[4] + 3) = bVar20;
  *(byte *)((long)level[4] + 4) = bVar21;
  *(byte *)((long)level[4] + 5) = bVar22;
  *(byte *)((long)level[4] + 6) = bVar23;
  *(byte *)((long)level[4] + 7) = bVar24;
  *(byte *)(level[4] + 1) = bVar25;
  *(byte *)((long)level[4] + 9) = bVar26;
  *(byte *)((long)level[4] + 10) = bVar27;
  *(byte *)((long)level[4] + 0xb) = bVar28;
  *(byte *)((long)level[4] + 0xc) = bVar29;
  *(byte *)((long)level[4] + 0xd) = bVar30;
  *(byte *)((long)level[4] + 0xe) = bVar31;
  *(byte *)((long)level[4] + 0xf) = bVar32;
  pavgb(0,bVar65 + bVar49 + bVar33 + ((3 < bVar1) * '\x03' | (3 >= bVar1) * bVar1) + bVar17);
  pavgb(0,bVar66 + bVar50 + bVar34 + ((3 < bVar2) * '\x03' | (3 >= bVar2) * bVar2) + bVar18);
  pavgb(0,bVar67 + bVar51 + bVar35 + ((3 < bVar3) * '\x03' | (3 >= bVar3) * bVar3) + bVar19);
  pavgb(0,bVar68 + bVar52 + bVar36 + ((3 < bVar4) * '\x03' | (3 >= bVar4) * bVar4) + bVar20);
  pavgb(0,bVar69 + bVar53 + bVar37 + ((3 < bVar5) * '\x03' | (3 >= bVar5) * bVar5) + bVar21);
  pavgb(0,bVar70 + bVar54 + bVar38 + ((3 < bVar6) * '\x03' | (3 >= bVar6) * bVar6) + bVar22);
  pavgb(0,bVar71 + bVar55 + bVar39 + ((3 < bVar7) * '\x03' | (3 >= bVar7) * bVar7) + bVar23);
  pavgb(0,bVar72 + bVar56 + bVar40 + ((3 < bVar8) * '\x03' | (3 >= bVar8) * bVar8) + bVar24);
  pavgb(0,bVar73 + bVar57 + bVar41 + ((3 < bVar9) * '\x03' | (3 >= bVar9) * bVar9) + bVar25);
  pavgb(0,bVar74 + bVar58 + bVar42 + ((3 < bVar10) * '\x03' | (3 >= bVar10) * bVar10) + bVar26);
  pavgb(0,bVar75 + bVar59 + bVar43 + ((3 < bVar11) * '\x03' | (3 >= bVar11) * bVar11) + bVar27);
  pavgb(0,bVar76 + bVar60 + bVar44 + ((3 < bVar12) * '\x03' | (3 >= bVar12) * bVar12) + bVar28);
  pavgb(0,bVar77 + bVar61 + bVar45 + ((3 < bVar13) * '\x03' | (3 >= bVar13) * bVar13) + bVar29);
  pavgb(0,bVar78 + bVar62 + bVar46 + ((3 < bVar14) * '\x03' | (3 >= bVar14) * bVar14) + bVar30);
  pavgb(0,bVar79 + bVar63 + bVar47 + ((3 < bVar15) * '\x03' | (3 >= bVar15) * bVar15) + bVar31);
  pavgb(0,bVar80 + bVar64 + bVar48 + ((3 < bVar16) * '\x03' | (3 >= bVar16) * bVar16) + bVar32);
  alVar81[1] = in_RDX;
  alVar81[0] = in_RAX;
  return alVar81;
}

Assistant:

static inline __m128i get_coeff_contexts_kernel_sse2(__m128i *const level) {
  const __m128i const_3 = _mm_set1_epi8(3);
  const __m128i const_4 = _mm_set1_epi8(4);
  __m128i count;

  count = _mm_min_epu8(level[0], const_3);
  level[1] = _mm_min_epu8(level[1], const_3);
  level[2] = _mm_min_epu8(level[2], const_3);
  level[3] = _mm_min_epu8(level[3], const_3);
  level[4] = _mm_min_epu8(level[4], const_3);
  count = _mm_add_epi8(count, level[1]);
  count = _mm_add_epi8(count, level[2]);
  count = _mm_add_epi8(count, level[3]);
  count = _mm_add_epi8(count, level[4]);
  count = _mm_avg_epu8(count, _mm_setzero_si128());
  count = _mm_min_epu8(count, const_4);
  return count;
}